

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O1

char * __thiscall tetgenio::findnextnumber(tetgenio *this,char *string)

{
  ulong uVar1;
  char *result;
  
  while ((0x2c < (ulong)(byte)*string ||
         ((0x100900000201U >> ((ulong)(byte)*string & 0x3f) & 1) == 0))) {
    string = (char *)((byte *)string + 1);
  }
  do {
    uVar1 = (ulong)(byte)*string;
    if (uVar1 < 0x2f) {
      if ((0x680000000001U >> (uVar1 & 0x3f) & 1) != 0) {
        return string;
      }
      if (uVar1 == 0x23) {
        *string = 0;
        return string;
      }
    }
    if (0xf5 < (byte)(*string - 0x3aU)) {
      return string;
    }
    string = (char *)((byte *)string + 1);
  } while( true );
}

Assistant:

char* tetgenio::findnextnumber(char *string)
{
  char *result;

  result = string;
  // Skip the current field.  Stop upon reaching whitespace or a comma.
  while ((*result != '\0') && (*result != '#') && (*result != ' ') && 
         (*result != '\t') && (*result != ',')) {
    result++;
  }
  // Now skip the whitespace and anything else that doesn't look like a
  //   number, a comment, or the end of a line. 
  while ((*result != '\0') && (*result != '#')
         && (*result != '.') && (*result != '+') && (*result != '-')
         && ((*result < '0') || (*result > '9'))) {
    result++;
  }
  // Check for a comment (prefixed with `#').
  if (*result == '#') {
    *result = '\0';
  }
  return result;
}